

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.cc
# Opt level: O0

bool detect_and_check_crc(uint8_t *buf,size_t buf_len,uint32_t checksum,crc_mode_e *mode)

{
  bool bVar1;
  undefined4 *in_RCX;
  uint32_t in_EDX;
  size_t in_RSI;
  uint8_t *in_RDI;
  crc_mode_e in_stack_ffffffffffffffe0;
  
  *in_RCX = 0;
  bVar1 = perform_integrity_check(in_RDI,in_RSI,in_EDX,in_stack_ffffffffffffffe0);
  if (bVar1) {
    *in_RCX = 1;
  }
  return bVar1;
}

Assistant:

bool detect_and_check_crc(const uint8_t* buf,
                          size_t buf_len,
                          uint32_t checksum,
                          crc_mode_e* mode) {
    *mode = CRC_UNKNOWN;
#ifdef _CRC32C
    if (perform_integrity_check(buf, buf_len, checksum, CRC32C)) {
        *mode = CRC32C;
        return true;
    } else
#endif
    if (perform_integrity_check(buf, buf_len, checksum, CRC32)) {
        *mode = CRC32;
        return true;
    }

    return false;
}